

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextEditState::OnKeyPressed(ImGuiTextEditState *this,int key)

{
  STB_TexteditState *state;
  ImWchar *pIVar1;
  float fVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  unsigned_short *puVar12;
  float fVar13;
  StbUndoRecord *pSVar14;
  bool bVar15;
  short sVar16;
  int temp;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ImGuiStb *pIVar24;
  long lVar25;
  int iVar26;
  ImGuiTextEditState *str;
  short *psVar27;
  uint uVar28;
  ulong uVar29;
  undefined8 in_R8;
  int iVar30;
  uint uVar31;
  bool bVar32;
  float fVar33;
  StbFindState find;
  ImWchar *text_remaining;
  ImWchar local_60 [6];
  int local_54;
  int local_50;
  int local_4c;
  short *local_48;
  long local_40;
  ImWchar *local_38;
  
  state = &this->StbState;
  bVar3 = (this->StbState).single_line;
LAB_0013591a:
  uVar31 = (uint)bVar3;
  iVar21 = (int)in_R8;
  switch(key) {
  case 0x10000:
    goto switchD_0013592d_caseD_10000;
  case 0x10001:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      (this->StbState).cursor = (this->StbState).cursor + 1;
      iVar21 = this->CurLenW;
    }
    else {
      ImGuiStb::stb_textedit_move_to_last(this,state);
      iVar21 = this->CurLenW;
      iVar30 = (this->StbState).select_start;
      iVar20 = (this->StbState).select_end;
      if (iVar30 != iVar20) {
        if (iVar21 < iVar30) {
          (this->StbState).select_start = iVar21;
          iVar30 = iVar21;
        }
        if (iVar21 < iVar20) {
          (this->StbState).select_end = iVar21;
          iVar20 = iVar21;
        }
        if (iVar30 == iVar20) {
          state->cursor = iVar30;
        }
      }
    }
    if (state->cursor <= iVar21) goto LAB_0013664e;
    goto LAB_001360a1;
  case 0x10002:
switchD_0013592d_caseD_10002:
    if (bVar3 == 0) {
      uVar31 = (this->StbState).select_start;
      str = (ImGuiTextEditState *)(ulong)uVar31;
      uVar22 = (this->StbState).select_end;
      if ((key & 0x20000U) == 0) {
        if (uVar31 == uVar22) {
          str = (ImGuiTextEditState *)(ulong)(uint)state->cursor;
        }
        else {
          if ((int)uVar22 < (int)uVar31) {
            (this->StbState).select_start = uVar22;
            str = (ImGuiTextEditState *)(ulong)uVar22;
          }
          (this->StbState).cursor = (int)str;
          (this->StbState).select_end = (int)str;
          (this->StbState).has_preferred_x = '\0';
        }
LAB_001361d6:
        uVar28 = this->CurLenW;
      }
      else {
        if (uVar31 == uVar22) {
          uVar31 = (this->StbState).cursor;
          str = (ImGuiTextEditState *)(ulong)uVar31;
          (this->StbState).select_end = uVar31;
          (this->StbState).select_start = uVar31;
          goto LAB_001361d6;
        }
        (this->StbState).cursor = uVar22;
        uVar28 = this->CurLenW;
        if ((int)uVar28 < (int)uVar31) {
          (this->StbState).select_start = uVar28;
          str = (ImGuiTextEditState *)(ulong)uVar28;
        }
        uVar31 = uVar22;
        if ((int)uVar28 < (int)uVar22) {
          (this->StbState).select_end = uVar28;
          uVar31 = uVar28;
        }
        if ((uint)str == uVar31) {
          state->cursor = (uint)str;
        }
        else {
          str = (ImGuiTextEditState *)(ulong)uVar22;
        }
      }
      if ((int)uVar28 < (int)str) {
        state->cursor = uVar28;
        str = (ImGuiTextEditState *)(ulong)uVar28;
      }
      ImGuiStb::stb_textedit_find_charpos((ImGuiStb *)local_60,(StbFindState *)this,str,0,iVar21);
      if (local_4c == local_54) goto LAB_00136652;
      pIVar24 = (ImGuiStb *)&(this->StbState).preferred_x;
      if ((this->StbState).has_preferred_x == '\0') {
        pIVar24 = (ImGuiStb *)local_60;
      }
      fVar2 = *(float *)pIVar24;
      (this->StbState).cursor = local_4c;
      puVar12 = (this->Text).Data;
      local_38 = (ImWchar *)0x0;
      pIVar1 = puVar12 + local_4c;
      InputTextCalcTextSizeW(pIVar1,puVar12 + this->CurLenW,&local_38,(ImVec2 *)0x1,SUB81(in_R8,0));
      iVar21 = (int)((ulong)((long)local_38 - (long)pIVar1) >> 1);
      if (iVar21 < 1) goto LAB_001362a6;
      iVar30 = 0;
      fVar13 = 0.0;
      goto LAB_0013626c;
    }
    key = key & 0x20000U | 0x10000;
    goto LAB_0013591a;
  case 0x10003:
switchD_0013592d_caseD_10003:
    if (uVar31 != 0) goto code_r0x0013596b;
    uVar31 = (this->StbState).select_start;
    uVar22 = (this->StbState).select_end;
    if ((key & 0x20000U) == 0) {
      if (uVar31 != uVar22) {
        ImGuiStb::stb_textedit_move_to_last(this,state);
        uVar31 = (this->StbState).select_start;
        uVar22 = (this->StbState).select_end;
        goto LAB_001360be;
      }
LAB_00135eaf:
      uVar28 = this->CurLenW;
    }
    else {
      if (uVar31 == uVar22) {
        iVar21 = (this->StbState).cursor;
        (this->StbState).select_end = iVar21;
        (this->StbState).select_start = iVar21;
        goto LAB_00135eaf;
      }
      state->cursor = uVar22;
LAB_001360be:
      uVar28 = this->CurLenW;
      if (uVar31 != uVar22) {
        if ((int)uVar28 < (int)uVar31) {
          (this->StbState).select_start = uVar28;
          uVar31 = uVar28;
        }
        if ((int)uVar28 < (int)uVar22) {
          (this->StbState).select_end = uVar28;
          uVar22 = uVar28;
        }
        if (uVar31 == uVar22) {
          state->cursor = uVar31;
        }
      }
    }
    uVar31 = state->cursor;
    if ((int)uVar28 < state->cursor) {
      state->cursor = uVar28;
      uVar31 = uVar28;
    }
    ImGuiStb::stb_textedit_find_charpos
              ((ImGuiStb *)local_60,(StbFindState *)this,(ImGuiTextEditState *)(ulong)uVar31,
               (uint)(this->StbState).single_line,(int)in_R8);
    if ((long)local_50 == 0) goto LAB_00136652;
    pIVar24 = (ImGuiStb *)&(this->StbState).preferred_x;
    if ((this->StbState).has_preferred_x == '\0') {
      pIVar24 = (ImGuiStb *)local_60;
    }
    fVar2 = *(float *)pIVar24;
    lVar23 = (long)local_54 + (long)local_50;
    iVar21 = (int)lVar23;
    (this->StbState).cursor = iVar21;
    puVar12 = (this->Text).Data;
    local_38 = (ImWchar *)0x0;
    pIVar1 = puVar12 + lVar23;
    InputTextCalcTextSizeW(pIVar1,puVar12 + this->CurLenW,&local_38,(ImVec2 *)0x1,SUB81(in_R8,0));
    iVar30 = (int)((ulong)((long)local_38 - (long)pIVar1) >> 1);
    if (iVar30 < 1) goto LAB_001362a6;
    fVar13 = 0.0;
    iVar20 = 0;
    goto LAB_0013617f;
  case 0x10004:
    uVar22 = this->CurLenW;
    uVar28 = (this->StbState).select_start;
    uVar17 = (this->StbState).select_end;
    uVar18 = uVar28;
    if (uVar28 != uVar17) {
      if ((int)uVar22 < (int)uVar28) {
        (this->StbState).select_start = uVar22;
        uVar28 = uVar22;
      }
      if ((int)uVar22 < (int)uVar17) {
        (this->StbState).select_end = uVar22;
        uVar17 = uVar22;
      }
      uVar18 = uVar17;
      if (uVar28 == uVar17) {
        state->cursor = uVar28;
        uVar18 = uVar28;
      }
    }
    uVar17 = state->cursor;
    if ((int)uVar22 < state->cursor) {
      state->cursor = uVar22;
      uVar17 = uVar22;
    }
    if (uVar28 != uVar18) {
      uVar17 = uVar28;
      if ((int)uVar18 < (int)uVar28) {
        (this->StbState).select_start = uVar18;
        uVar17 = uVar18;
      }
      (this->StbState).cursor = uVar17;
      (this->StbState).select_end = uVar17;
      (this->StbState).has_preferred_x = '\0';
    }
    ImGuiStb::stb_textedit_find_charpos
              ((ImGuiStb *)local_60,(StbFindState *)this,(ImGuiTextEditState *)(ulong)uVar17,uVar31,
               iVar21);
    break;
  case 0x10005:
    uVar22 = this->CurLenW;
    uVar28 = (this->StbState).select_start;
    uVar17 = (this->StbState).select_end;
    uVar18 = uVar28;
    if (uVar28 != uVar17) {
      if ((int)uVar22 < (int)uVar28) {
        (this->StbState).select_start = uVar22;
        uVar28 = uVar22;
      }
      if ((int)uVar22 < (int)uVar17) {
        (this->StbState).select_end = uVar22;
        uVar17 = uVar22;
      }
      uVar18 = uVar17;
      if (uVar28 == uVar17) {
        state->cursor = uVar28;
        uVar18 = uVar28;
      }
    }
    uVar17 = state->cursor;
    if ((int)uVar22 < state->cursor) {
      state->cursor = uVar22;
      uVar17 = uVar22;
    }
    if (uVar28 != uVar18) {
      uVar17 = uVar28;
      if ((int)uVar18 < (int)uVar28) {
        (this->StbState).select_start = uVar18;
        uVar17 = uVar18;
      }
      (this->StbState).cursor = uVar17;
      (this->StbState).select_end = uVar17;
      (this->StbState).has_preferred_x = '\0';
    }
    ImGuiStb::stb_textedit_find_charpos
              ((ImGuiStb *)local_60,(StbFindState *)this,(ImGuiTextEditState *)(ulong)uVar17,uVar31,
               iVar21);
    (this->StbState).has_preferred_x = '\0';
    lVar23 = (long)local_54 + (long)local_50;
    iVar21 = (int)lVar23;
    (this->StbState).cursor = iVar21;
    if ((long)local_50 < 1) goto LAB_00136652;
    if ((this->Text).Size < iVar21) goto LAB_00136672;
    if ((this->Text).Data[lVar23 + -1] == 10) {
      state->cursor = iVar21 + -1;
    }
    goto LAB_00136652;
  case 0x10006:
    (this->StbState).select_end = 0;
    (this->StbState).cursor = 0;
    (this->StbState).select_start = 0;
    goto LAB_0013664e;
  case 0x10007:
    (this->StbState).cursor = this->CurLenW;
    (this->StbState).select_start = 0;
    (this->StbState).select_end = 0;
    goto LAB_0013664e;
  case 0x10008:
switchD_0013592d_caseD_10008:
    if ((this->StbState).select_start != (this->StbState).select_end) goto LAB_001359d7;
    iVar21 = (this->StbState).cursor;
    if (iVar21 < this->CurLenW) {
      ImGuiStb::stb_textedit_delete(this,state,iVar21,1);
    }
    goto LAB_0013664e;
  case 0x10009:
switchD_0013592d_caseD_10009:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar21 = this->CurLenW;
      iVar30 = (this->StbState).cursor;
      if (iVar21 < iVar30) {
        state->cursor = iVar21;
        iVar30 = iVar21;
      }
      if (0 < iVar30) {
        ImGuiStb::stb_textedit_delete(this,state,iVar30 + -1,1);
        (this->StbState).cursor = (this->StbState).cursor + -1;
      }
    }
    else {
LAB_001359d7:
      ImGuiStb::stb_textedit_delete_selection(this,state);
    }
    goto LAB_0013664e;
  case 0x1000a:
    lVar23 = (long)(this->StbState).undostate.undo_point;
    if (lVar23 == 0) goto LAB_0013664e;
    iVar21 = (this->StbState).undostate.undo_rec[lVar23 + -1].where;
    sVar4 = (this->StbState).undostate.undo_rec[lVar23 + -1].insert_length;
    iVar30 = (int)sVar4;
    sVar5 = (this->StbState).undostate.undo_rec[lVar23 + -1].delete_length;
    uVar31 = (uint)sVar5;
    lVar23 = (long)(this->StbState).undostate.undo_rec[lVar23 + -1].char_storage;
    uVar29 = (ulong)(this->StbState).undostate.redo_point;
    (this->StbState).undostate.undo_rec[uVar29 - 1].char_storage = -1;
    (this->StbState).undostate.undo_rec[uVar29 - 1].insert_length = sVar5;
    (this->StbState).undostate.undo_rec[uVar29 - 1].delete_length = sVar4;
    (this->StbState).undostate.undo_rec[uVar29 - 1].where = iVar21;
    if (sVar5 == 0) goto LAB_00136607;
    local_40 = lVar23;
    if (0x3e6 < (int)((int)(this->StbState).undostate.undo_char_point + uVar31)) {
      (this->StbState).undostate.undo_rec[uVar29 - 1].insert_length = 0;
      goto LAB_001365ec;
    }
    local_48 = &(this->StbState).undostate.undo_rec[0].char_storage;
    goto LAB_001363c9;
  case 0x1000b:
    lVar23 = (long)(this->StbState).undostate.redo_point;
    if (lVar23 == 99) goto LAB_0013664e;
    sVar4 = (this->StbState).undostate.undo_point;
    iVar21 = (this->StbState).undostate.undo_rec[lVar23].where;
    sVar5 = (this->StbState).undostate.undo_rec[lVar23].insert_length;
    iVar30 = (int)sVar5;
    sVar6 = (this->StbState).undostate.undo_rec[lVar23].delete_length;
    sVar16 = (this->StbState).undostate.undo_rec[lVar23].char_storage;
    (this->StbState).undostate.undo_rec[sVar4].delete_length = sVar5;
    (this->StbState).undostate.undo_rec[sVar4].insert_length = sVar6;
    (this->StbState).undostate.undo_rec[sVar4].where = iVar21;
    (this->StbState).undostate.undo_rec[sVar4].char_storage = -1;
    if (sVar6 == 0) goto LAB_00136531;
    sVar7 = (this->StbState).undostate.undo_char_point;
    if ((int)(this->StbState).undostate.redo_char_point < (int)sVar7 + (int)sVar6) {
      pSVar14 = (this->StbState).undostate.undo_rec + sVar4;
      pSVar14->insert_length = 0;
      pSVar14->delete_length = 0;
      goto LAB_00136526;
    }
    (this->StbState).undostate.undo_rec[sVar4].char_storage = sVar7;
    (this->StbState).undostate.undo_char_point = sVar7 + sVar6;
    if (sVar6 < 1) goto LAB_00136526;
    iVar20 = (this->Text).Size;
    if (iVar20 < iVar21) {
      iVar20 = iVar21;
    }
    puVar12 = (this->Text).Data;
    uVar29 = 0;
    goto LAB_001364fa;
  case 0x1000c:
    iVar21 = (this->StbState).select_start;
    iVar30 = (this->StbState).select_end;
    bVar32 = SBORROW4(iVar21,iVar30);
    iVar20 = iVar21 - iVar30;
    bVar15 = iVar21 == iVar30;
    if (!bVar15) goto LAB_00135c2d;
    iVar21 = state->cursor;
    if (0 < iVar21) goto LAB_00135bd4;
    iVar30 = iVar21 + -1;
    goto LAB_001364b7;
  case 0x1000d:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar21 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor + 1);
      goto LAB_001364be;
    }
    ImGuiStb::stb_textedit_move_to_last(this,state);
    goto LAB_00136652;
  default:
    switch(key) {
    case 0x30000:
      iVar21 = this->CurLenW;
      iVar20 = (this->StbState).select_start;
      iVar30 = (this->StbState).select_end;
      if (iVar20 == iVar30) {
        iVar20 = state->cursor;
LAB_00135fb1:
        iVar30 = iVar21;
        if (iVar20 < iVar21) {
          iVar30 = iVar20;
        }
        (this->StbState).select_end = iVar30;
        (this->StbState).select_start = iVar30;
      }
      else {
        if (iVar21 < iVar20) {
          (this->StbState).select_start = iVar21;
          iVar20 = iVar21;
        }
        if (iVar21 < iVar30) {
          (this->StbState).select_end = iVar21;
          iVar30 = iVar21;
        }
        if (iVar20 == iVar30) goto LAB_00135fb1;
      }
      if (0 < iVar30) {
        iVar30 = iVar30 + -1;
        (this->StbState).select_end = iVar30;
      }
      (this->StbState).cursor = iVar30;
      goto LAB_0013664e;
    case 0x30001:
      iVar21 = (this->StbState).select_start;
      iVar30 = (this->StbState).select_end;
      if (iVar21 == iVar30) {
        iVar21 = (this->StbState).cursor;
        (this->StbState).select_start = iVar21;
        iVar30 = iVar21;
      }
      iVar20 = iVar30 + 1;
      (this->StbState).select_end = iVar20;
      if (iVar21 != iVar20) {
        iVar19 = this->CurLenW;
        if (iVar19 < iVar21) {
          (this->StbState).select_start = iVar19;
        }
        iVar21 = iVar20;
        if (iVar19 <= iVar30) {
          (this->StbState).select_end = iVar19;
          iVar21 = iVar19;
        }
      }
      (this->StbState).cursor = iVar21;
      goto LAB_0013664e;
    case 0x30002:
      goto switchD_0013592d_caseD_10002;
    case 0x30003:
      goto switchD_0013592d_caseD_10003;
    case 0x30004:
      uVar22 = this->CurLenW;
      uVar28 = (this->StbState).select_start;
      uVar17 = (this->StbState).select_end;
      uVar18 = uVar28;
      if (uVar28 != uVar17) {
        if ((int)uVar22 < (int)uVar28) {
          (this->StbState).select_start = uVar22;
          uVar28 = uVar22;
        }
        if ((int)uVar22 < (int)uVar17) {
          (this->StbState).select_end = uVar22;
          uVar17 = uVar22;
        }
        uVar18 = uVar17;
        if (uVar28 == uVar17) {
          state->cursor = uVar28;
          uVar18 = uVar28;
        }
      }
      uVar17 = state->cursor;
      if ((int)uVar22 < state->cursor) {
        state->cursor = uVar22;
        uVar17 = uVar22;
      }
      if (uVar28 == uVar18) {
        (this->StbState).select_end = uVar17;
        (this->StbState).select_start = uVar17;
        uVar18 = uVar17;
      }
      else {
        state->cursor = uVar18;
      }
      ImGuiStb::stb_textedit_find_charpos
                ((ImGuiStb *)local_60,(StbFindState *)this,(ImGuiTextEditState *)(ulong)uVar18,
                 uVar31,iVar21);
      break;
    case 0x30005:
      uVar22 = this->CurLenW;
      uVar28 = (this->StbState).select_start;
      uVar17 = (this->StbState).select_end;
      uVar18 = uVar28;
      if (uVar28 != uVar17) {
        if ((int)uVar22 < (int)uVar28) {
          (this->StbState).select_start = uVar22;
          uVar28 = uVar22;
        }
        if ((int)uVar22 < (int)uVar17) {
          (this->StbState).select_end = uVar22;
          uVar17 = uVar22;
        }
        uVar18 = uVar17;
        if (uVar28 == uVar17) {
          state->cursor = uVar28;
          uVar18 = uVar28;
        }
      }
      uVar17 = state->cursor;
      if ((int)uVar22 < state->cursor) {
        state->cursor = uVar22;
        uVar17 = uVar22;
      }
      if (uVar28 == uVar18) {
        (this->StbState).select_end = uVar17;
        (this->StbState).select_start = uVar17;
        uVar18 = uVar17;
      }
      else {
        state->cursor = uVar18;
      }
      ImGuiStb::stb_textedit_find_charpos
                ((ImGuiStb *)local_60,(StbFindState *)this,(ImGuiTextEditState *)(ulong)uVar18,
                 uVar31,iVar21);
      (this->StbState).has_preferred_x = '\0';
      uVar29 = (long)local_54 + (long)local_50;
      iVar21 = (int)uVar29;
      (this->StbState).cursor = iVar21;
      if (0 < (long)local_50) {
        if ((this->Text).Size < iVar21) goto LAB_00136672;
        if ((this->Text).Data[uVar29 - 1] == 10) {
          uVar29 = (ulong)(iVar21 - 1U);
          state->cursor = iVar21 - 1U;
        }
      }
      (this->StbState).select_end = (int)uVar29;
      goto LAB_00136652;
    case 0x30006:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_start = (this->StbState).cursor;
      }
      local_54 = 0;
      break;
    case 0x30007:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_start = (this->StbState).cursor;
      }
      local_54 = this->CurLenW;
      break;
    case 0x30008:
      goto switchD_0013592d_caseD_10008;
    case 0x30009:
      goto switchD_0013592d_caseD_10009;
    default:
      uVar31 = 0;
      if (key < 0x10000) {
        uVar31 = key;
      }
      if ((int)uVar31 < 1) goto LAB_00136652;
      local_60[0] = (ImWchar)uVar31;
      if (uVar31 == 10 && bVar3 != 0) goto LAB_00136652;
      if ((((this->StbState).insert_mode == '\0') ||
          ((this->StbState).select_start != (this->StbState).select_end)) ||
         (iVar30 = (this->StbState).cursor, this->CurLenW <= iVar30)) {
        ImGuiStb::stb_textedit_delete_selection(this,state);
        bVar15 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_60,1);
        if (!bVar15) goto LAB_00136652;
        ImGuiStb::stb_text_createundo(&(this->StbState).undostate,(this->StbState).cursor,0,1);
      }
      else {
        ImGuiStb::stb_text_makeundo_replace(this,state,iVar30,(uint)(bVar3 == 0),iVar21);
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
        bVar15 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_60,1);
        if (!bVar15) goto LAB_00136652;
      }
      (this->StbState).cursor = (this->StbState).cursor + 1;
      goto LAB_0013664e;
    case 0x3000c:
      iVar21 = (this->StbState).cursor;
      iVar30 = (this->StbState).select_start;
      if (iVar30 == (this->StbState).select_end) {
        (this->StbState).select_end = iVar21;
        (this->StbState).select_start = iVar21;
        iVar30 = iVar21;
      }
      if (0 < iVar21) goto LAB_00135adb;
      iVar20 = iVar21 + -1;
      goto LAB_00136327;
    case 0x3000d:
      iVar21 = (this->StbState).cursor;
      iVar30 = (this->StbState).select_start;
      if (iVar30 == (this->StbState).select_end) {
        (this->StbState).select_end = iVar21;
        (this->StbState).select_start = iVar21;
        iVar30 = iVar21;
      }
      iVar21 = iVar21 + 1;
      iVar20 = this->CurLenW;
      iVar19 = iVar20;
      if (iVar21 < iVar20) goto LAB_00135b50;
      goto LAB_00135fd2;
    }
    (this->StbState).select_end = local_54;
  }
  (this->StbState).cursor = local_54;
  goto LAB_0013664e;
  while (iVar21 = iVar21 + 1, iVar30 = iVar20, iVar20 != iVar21) {
LAB_00135b50:
    iVar19 = ImGuiStb::is_word_boundary_from_right(this,iVar21);
    iVar30 = iVar21;
    if (iVar19 != 0) break;
  }
  iVar21 = iVar30;
  iVar30 = (this->StbState).select_start;
  iVar19 = this->CurLenW;
LAB_00135fd2:
  if (iVar21 < iVar20) {
    iVar20 = iVar21;
  }
  (this->StbState).cursor = iVar20;
  (this->StbState).select_end = iVar20;
  if (iVar30 != iVar20) {
    iVar21 = iVar30;
    if (iVar19 < iVar30) {
      (this->StbState).select_start = iVar19;
      iVar21 = iVar19;
    }
    iVar26 = iVar20;
    if (iVar19 < iVar20) {
      (this->StbState).select_end = iVar19;
      iVar26 = iVar19;
    }
    iVar30 = iVar20;
    if (iVar21 == iVar26) {
      state->cursor = iVar21;
      iVar30 = iVar21;
    }
  }
  if (iVar30 <= iVar19) goto LAB_00136652;
  goto LAB_00136361;
  while (iVar30 = iVar21 + -1, bVar15 = 0 < iVar21, iVar21 = iVar30, iVar30 != 0 && bVar15) {
LAB_00135adb:
    iVar20 = iVar21 + -1;
    iVar30 = ImGuiStb::is_word_boundary_from_right(this,iVar20);
    if (iVar30 != 0) goto LAB_00135af7;
  }
  iVar20 = -1;
LAB_00135af7:
  iVar30 = (this->StbState).select_start;
LAB_00136327:
  iVar21 = 0;
  if (0 < iVar20) {
    iVar21 = iVar20;
  }
  (this->StbState).cursor = iVar21;
  (this->StbState).select_end = iVar21;
  iVar19 = this->CurLenW;
  if (iVar30 != iVar21) {
    iVar20 = iVar30;
    if (iVar19 < iVar30) {
      (this->StbState).select_start = iVar19;
      iVar20 = iVar19;
    }
    iVar26 = iVar21;
    if (iVar19 < iVar21) {
      (this->StbState).select_end = iVar19;
      iVar26 = iVar19;
    }
    iVar30 = iVar21;
    if (iVar20 == iVar26) {
      state->cursor = iVar20;
      iVar30 = iVar20;
    }
  }
  if (iVar30 <= iVar19) goto LAB_00136652;
LAB_00136361:
  state->cursor = iVar19;
  goto LAB_00136652;
  while (iVar30 = iVar21 + -1, bVar15 = 0 < iVar21, iVar21 = iVar30, iVar30 != 0 && bVar15) {
LAB_00135bd4:
    iVar30 = iVar21 + -1;
    iVar20 = ImGuiStb::is_word_boundary_from_right(this,iVar30);
    if (iVar20 != 0) goto LAB_001364b7;
  }
  iVar30 = -1;
LAB_001364b7:
  iVar21 = 0;
  if (0 < iVar30) {
    iVar21 = iVar30;
  }
LAB_001364be:
  (this->StbState).cursor = iVar21;
  ImGuiStb::stb_textedit_clamp((ImGuiTextEditState *)(ulong)(uint)this->CurLenW,state);
  goto LAB_00136652;
  while( true ) {
    (this->StbState).undostate.undo_char
    [(long)(this->StbState).undostate.undo_rec[sVar4].char_storage + uVar29] =
         puVar12[(long)iVar21 + uVar29];
    uVar29 = uVar29 + 1;
    if ((long)(this->StbState).undostate.undo_rec[sVar4].insert_length <= (long)uVar29) break;
LAB_001364fa:
    if ((uint)(iVar20 - iVar21) == uVar29) goto LAB_00136672;
  }
LAB_00136526:
  ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar21,(int)sVar6);
LAB_00136531:
  if (sVar5 == 0) {
    iVar30 = 0;
  }
  else {
    ImGuiStb::STB_TEXTEDIT_INSERTCHARS
              (this,iVar21,(this->StbState).undostate.undo_char + sVar16,iVar30);
    psVar27 = &(this->StbState).undostate.redo_char_point;
    *psVar27 = *psVar27 + sVar5;
  }
  (this->StbState).cursor = iVar21 + iVar30;
  uVar8 = (this->StbState).undostate.undo_point;
  uVar10 = (this->StbState).undostate.redo_point;
  (this->StbState).undostate.undo_point = uVar8 + 1;
  (this->StbState).undostate.redo_point = uVar10 + 1;
  goto LAB_0013664e;
code_r0x001363e4:
  if (sVar16 < 99) {
    if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
      sVar7 = (this->StbState).undostate.undo_rec[0x62].insert_length;
      sVar16 = sVar6 + sVar7;
      (this->StbState).undostate.redo_char_point = sVar16;
      pIVar1 = (this->StbState).undostate.undo_char + sVar16;
      memmove(pIVar1,pIVar1 + -(long)sVar7,(long)sVar16 * -2 + 0x7ce);
      sVar16 = (this->StbState).undostate.redo_point;
      lVar23 = (long)sVar16;
      if (lVar23 < 0x62) {
        lVar25 = lVar23 + -0x62;
        psVar27 = local_48 + lVar23 * 6;
        do {
          if (-1 < *psVar27) {
            *psVar27 = *psVar27 + sVar7;
          }
          psVar27 = psVar27 + 6;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0);
      }
    }
    lVar23 = (long)sVar16;
    memmove((this->StbState).undostate.undo_rec + lVar23,
            (this->StbState).undostate.undo_rec + lVar23 + -1,(99 - lVar23) * 0xc);
    uVar22 = *(int *)&(this->StbState).undostate.redo_point + 1;
    uVar29 = (ulong)uVar22;
    (this->StbState).undostate.redo_point = (short)uVar22;
  }
  if ((short)uVar29 == 99) goto LAB_001365e7;
  goto LAB_001363c9;
code_r0x0013596b:
  key = key & 0x20000U | 0x10001;
  goto LAB_0013591a;
  while( true ) {
    state->cursor = state->cursor + 1;
    iVar20 = iVar20 + 1;
    if (iVar30 == iVar20) break;
LAB_0013617f:
    fVar33 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar21,iVar20);
    if (((fVar33 == -1.0) && (!NAN(fVar33))) || (fVar13 = fVar13 + fVar33, fVar2 < fVar13)) break;
  }
  goto LAB_001362a6;
  while( true ) {
    state->cursor = state->cursor + 1;
    iVar30 = iVar30 + 1;
    if (iVar21 == iVar30) break;
LAB_0013626c:
    fVar33 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,local_4c,iVar30);
    if (((fVar33 == -1.0) && (!NAN(fVar33))) || (fVar13 = fVar13 + fVar33, fVar2 < fVar13)) break;
  }
LAB_001362a6:
  iVar21 = this->CurLenW;
  iVar30 = (this->StbState).select_start;
  iVar20 = (this->StbState).select_end;
  if (iVar30 != iVar20) {
    if (iVar21 < iVar30) {
      (this->StbState).select_start = iVar21;
      iVar30 = iVar21;
    }
    if (iVar21 < iVar20) {
      (this->StbState).select_end = iVar21;
      iVar20 = iVar21;
    }
    if (iVar30 == iVar20) {
      state->cursor = iVar30;
    }
  }
  iVar30 = state->cursor;
  if (iVar21 < state->cursor) {
    state->cursor = iVar21;
    iVar30 = iVar21;
  }
  (this->StbState).has_preferred_x = '\x01';
  (this->StbState).preferred_x = fVar2;
  if ((key & 0x20000U) != 0) {
    (this->StbState).select_end = iVar30;
  }
  goto LAB_00136652;
switchD_0013592d_caseD_10000:
  iVar21 = (this->StbState).select_start;
  iVar30 = (this->StbState).select_end;
  bVar32 = SBORROW4(iVar21,iVar30);
  iVar20 = iVar21 - iVar30;
  bVar15 = iVar21 == iVar30;
  if (bVar15) {
    if (0 < state->cursor) {
      iVar21 = state->cursor + -1;
LAB_001360a1:
      state->cursor = iVar21;
    }
  }
  else {
LAB_00135c2d:
    if (!bVar15 && bVar32 == iVar20 < 0) {
      (this->StbState).select_start = iVar30;
      iVar21 = iVar30;
    }
    (this->StbState).cursor = iVar21;
    (this->StbState).select_end = iVar21;
  }
  goto LAB_0013664e;
LAB_001363c9:
  iVar20 = (int)(this->StbState).undostate.undo_char_point + uVar31;
  sVar6 = (this->StbState).undostate.redo_char_point;
  sVar16 = (short)uVar29;
  if (sVar6 < iVar20) goto code_r0x001363e4;
  (this->StbState).undostate.undo_rec[(long)sVar16 + -1].char_storage = sVar6 - sVar5;
  (this->StbState).undostate.redo_char_point = sVar6 - sVar5;
  if (sVar5 < 1) goto LAB_001365ec;
  iVar19 = (this->Text).Size;
  if (iVar19 < iVar21) {
    iVar19 = iVar21;
  }
  puVar12 = (this->Text).Data;
  uVar29 = 0;
  do {
    if ((uint)(iVar19 - iVar21) == uVar29) {
LAB_00136672:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x35c,
                    "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                   );
    }
    (this->StbState).undostate.undo_char
    [(long)(this->StbState).undostate.undo_rec[(long)sVar16 + -1].char_storage + uVar29] =
         puVar12[(long)iVar21 + uVar29];
    uVar29 = uVar29 + 1;
  } while (uVar31 != uVar29);
LAB_001365e7:
  if (iVar20 <= sVar6) {
LAB_001365ec:
    ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar21,uVar31);
    lVar23 = local_40;
LAB_00136607:
    if (sVar4 == 0) {
      iVar30 = 0;
    }
    else {
      ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                (this,iVar21,(this->StbState).undostate.undo_char + lVar23,iVar30);
      psVar27 = &(this->StbState).undostate.undo_char_point;
      *psVar27 = *psVar27 - sVar4;
    }
    (this->StbState).cursor = iVar21 + iVar30;
    uVar9 = (this->StbState).undostate.undo_point;
    uVar11 = (this->StbState).undostate.redo_point;
    (this->StbState).undostate.undo_point = uVar9 + -1;
    (this->StbState).undostate.redo_point = uVar11 + -1;
  }
LAB_0013664e:
  (this->StbState).has_preferred_x = '\0';
LAB_00136652:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiTextEditState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}